

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_set(event_base *base,event *ev)

{
  event *ev_local;
  event_base *base_local;
  
  if ((ev->ev_evcallback).evcb_flags == 0x80) {
    event_debug_assert_is_setup_(ev);
    ev->ev_base = base;
    (ev->ev_evcallback).evcb_pri = (uint8_t)((long)base->nactivequeues / 2);
    base_local._4_4_ = 0;
  }
  else {
    base_local._4_4_ = -1;
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_set(struct event_base *base, struct event *ev)
{
	/* Only innocent events may be assigned to a different base */
	if (ev->ev_flags != EVLIST_INIT)
		return (-1);

	event_debug_assert_is_setup_(ev);

	ev->ev_base = base;
	ev->ev_pri = base->nactivequeues/2;

	return (0);
}